

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O1

Quaternion * __thiscall COLLADABU::Math::Quaternion::unitInverse(Quaternion *this)

{
  Real RVar1;
  uint uVar2;
  undefined4 uVar3;
  uint uVar4;
  Quaternion *in_RDI;
  
  RVar1 = this->z;
  in_RDI->w = this->w;
  uVar2 = *(uint *)((long)&this->x + 4);
  uVar3 = *(undefined4 *)&this->y;
  uVar4 = *(uint *)((long)&this->y + 4);
  *(undefined4 *)&in_RDI->x = *(undefined4 *)&this->x;
  *(uint *)((long)&in_RDI->x + 4) = uVar2 ^ 0x80000000;
  *(undefined4 *)&in_RDI->y = uVar3;
  *(uint *)((long)&in_RDI->y + 4) = uVar4 ^ 0x80000000;
  in_RDI->z = -RVar1;
  return in_RDI;
}

Assistant:

Quaternion Quaternion::unitInverse () const
        {
            // assert:  'this' is unit length
            return Quaternion( w, -x, -y, -z );
        }